

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

double EDCircles::computeEllipsePerimeter(EllipseEquation *eq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_48;
  
  dVar8 = eq->coeff[1];
  dVar6 = eq->coeff[6];
  dVar1 = eq->coeff[2] / dVar8;
  dVar10 = eq->coeff[3] / dVar8;
  dVar7 = eq->coeff[4] / dVar8;
  dVar9 = eq->coeff[5] / dVar8;
  dVar11 = dVar8 / dVar8;
  if ((dVar1 != 0.0) || (dVar2 = dVar7, dVar3 = dVar11, NAN(dVar1))) {
    dVar2 = atan(dVar1 / (dVar11 - dVar10));
    local_48 = dVar2 * 0.5;
    dVar2 = local_48 + local_48;
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    dVar5 = cos(dVar2);
    dVar3 = ((1.0 - dVar5) * dVar10 + dVar4 * dVar1 + dVar3 + 1.0) * dVar11 * 0.5;
    sin(dVar2);
    cos(dVar2);
    dVar4 = cos(dVar2);
    dVar5 = sin(dVar2);
    dVar2 = cos(dVar2);
    dVar10 = ((dVar2 + 1.0) * dVar10 + ((1.0 - dVar4) - dVar5 * dVar1)) * dVar11 * 0.5;
    dVar11 = cos(local_48);
    dVar2 = sin(local_48);
    dVar2 = dVar11 * dVar7 + dVar2 * dVar9;
    dVar11 = sin(local_48);
    dVar4 = cos(local_48);
    dVar9 = dVar4 * dVar9 - dVar11 * dVar7;
  }
  dVar7 = (dVar2 / dVar3) * -0.5;
  dVar9 = (dVar9 / dVar10) * -0.5;
  dVar8 = (dVar7 * dVar7 * dVar3 + dVar9 * dVar9 * dVar10) - dVar6 / dVar8;
  dVar3 = dVar8 / dVar3;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar8 = dVar8 / dVar10;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    cos(local_48);
    sin(local_48);
    sin(local_48);
    cos(local_48);
  }
  dVar1 = dVar3 + dVar8;
  dVar8 = ((dVar3 - dVar8) * (dVar3 - dVar8)) / (dVar1 * dVar1);
  dVar6 = dVar8 * -3.0 + 4.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar1 * 3.14159265 * ((dVar8 * 3.0) / (dVar6 + 10.0) + 1.0);
}

Assistant:

double EDCircles::computeEllipsePerimeter(EllipseEquation * eq)
{
	double mult = 1;

	double A = eq->A()*mult;
	double B = eq->B()*mult;
	double C = eq->C()*mult;
	double D = eq->D()*mult;
	double E = eq->E()*mult;
	double F = eq->F()*mult;

	double A2, B2, C2, D2, E2, F2, theta;  //rotated coefficients
	double			   D3, E3, F3;             //ellipse form coefficients
	double cX, cY, a, b;		               //(cX,cY) center, a & b: semimajor & semiminor axes
	double h;							                 //h = (a-b)^2 / (a+b)^2
	bool rotation = false;

#define pi 3.14159265

	//Normalize coefficients
	B /= A; C /= A; D /= A; E /= A; F /= A; A /= A;

	if (B == 0) //Then not need to rotate the axes
	{
		A2 = A;
		B2 = B;
		C2 = C;
		D2 = D;
		E2 = E;
		F2 = F;

	}

	else if (B != 0) //Rotate the axes
	{
		rotation = true;

		//Determine the rotation angle (in radians)
		theta = atan(B / (A - C)) / 2;

		//Compute the coefficients wrt the new coordinate system 
		A2 = 0.5 * (A * (1 + cos(2 * theta) + B * sin(2 * theta) + C * (1 - cos(2 * theta))));

		B2 = (C - A) * sin(2 * theta) + B * cos(2 * theta); //B2 should turn to be zero?

		C2 = 0.5 * (A * (1 - cos(2 * theta) - B * sin(2 * theta) + C * (1 + cos(2 * theta))));

		D2 = D * cos(theta) + E * sin(theta);

		E2 = -D * sin(theta) + E * cos(theta);

		F2 = F;
	}

	//Transform the conic equation into the ellipse form
	D3 = D2 / A2; //normalize x term's coef 
				  //A3 = 1;     //A2 / A2

	E3 = E2 / C2; //normalize y term's coef
				  //C3 = 1;     //C2 / C2

	cX = -(D3 / 2);	//center X
	cY = -(E3 / 2);	//center Y

	F3 = A2 * pow(cX, 2.0) + C2 * pow(cY, 2.0) - F2;

	//semimajor axis
	a = sqrt(F3 / A2);
	//semiminor axis
	b = sqrt(F3 / C2);

	//Center coordinates have to be re-transformed if rotation is applied!
	if (rotation)
	{
		double tmpX = cX, tmpY = cY;
		cX = tmpX * cos(theta) - tmpY * sin(theta);
		cY = tmpX * sin(theta) + tmpY * cos(theta);
	}

	//Perimeter Computation(s)
	h = pow((a - b), 2.0) / pow((a + b), 2.0);

	//Ramajunan I
	//double P1 = pi * (a + b) * (3 - sqrt(4 - h));
	///printf("Perimeter of the ellipse is %.5f (Ramajunan I)\n", P1);

	//Ramajunan II
	double P2 = pi * (a + b) * (1 + 3 * h / (10 + sqrt(4 - 3 * h)));
	//	printf("Perimeter of the ellipse is %.5f (Ramajunan II)\n", P2);

	//  High-school formula
	//	double P3 = 2 * pi * sqrt(0.5 * (a*a + b*b));
	//	printf("Perimeter of the ellipse is %.5f (simple formula)\n", P3);

	return P2;
#undef pi
}